

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  char **ppcVar2;
  uint uVar3;
  int iVar4;
  yang_token yVar5;
  int iVar6;
  FILE *pFVar7;
  char *pcVar8;
  FILE *__stream;
  char *pcVar9;
  FILE *__stream_00;
  ulong uVar10;
  char *pcVar11;
  char **ppcVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  FILE *__stream_01;
  char *local_88;
  char *prefix;
  yang_token local_74;
  char **local_70;
  char **import_prefixes;
  char *name_space;
  FILE *local_58;
  char **local_50;
  char **import_modules;
  char *buf;
  int local_38;
  int import_count;
  int buf_len;
  
  if (argc == 1) {
    pcVar9 = (char *)0x0;
LAB_00101a56:
    pcVar11 = (char *)0x0;
  }
  else {
    if (argc != 3) {
      if (argc != 2) {
        main_cold_8();
        return 1;
      }
      pcVar9 = argv[1];
      iVar4 = strcmp(pcVar9,"-h");
      if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--help"), iVar4 == 0)) {
        fprintf(_stdout,"Usage:\n\t%s [input-file] [output-file]\n",*argv);
        return 0;
      }
      goto LAB_00101a56;
    }
    pcVar9 = argv[1];
    pcVar11 = argv[2];
  }
  pcVar15 = ".";
  if (pcVar9 == (char *)0x0) {
    pFVar7 = (FILE *)0x0;
  }
  else {
    pFVar7 = fopen(pcVar9,"r");
    if (pFVar7 == (FILE *)0x0) {
      main_cold_1();
      iVar4 = 1;
      pFVar7 = (FILE *)0x0;
      __stream = (FILE *)0x0;
      goto LAB_00101dba;
    }
    pcVar8 = strrchr(pcVar9,0x2f);
    if (pcVar8 != (char *)0x0) {
      *pcVar8 = '\0';
      pcVar15 = pcVar9;
    }
  }
  if (pcVar11 == (char *)0x0) {
    __stream = (FILE *)0x0;
  }
  else {
    __stream = fopen(pcVar11,"w");
    if (pFVar7 == (FILE *)0x0) {
      main_cold_2();
      iVar4 = 1;
      pFVar7 = (FILE *)0x0;
      goto LAB_00101dba;
    }
  }
  local_58 = __stream;
  if (__stream == (FILE *)0x0) {
    local_58 = _stdout;
  }
  __stream_01 = pFVar7;
  if (pFVar7 == (FILE *)0x0) {
    __stream_01 = _stdin;
  }
  import_modules = (char **)0x0;
  local_38 = 0;
  pcVar9 = get_word((FILE *)__stream_01,(char **)&import_modules,&local_38);
  if (pcVar9 == (char *)0x0) {
LAB_00101da4:
    iVar4 = -1;
  }
  else {
    yVar5 = get_keyword(pcVar9,(yang_arg *)&name_space);
    if ((yVar5 != YANG_MODULE) && (yVar5 != YANG_SUBMODULE)) {
      if (yVar5 == YANG_UNKNOWN) {
        fprintf(_stderr,"Unexpected characters (\"%.20s\"...).\n",pcVar9);
      }
      else {
        main_cold_7();
      }
      goto LAB_00101da4;
    }
    pcVar9 = get_word((FILE *)__stream_01,(char **)&import_modules,&local_38);
    if (pcVar9 == (char *)0x0) goto LAB_00101da4;
    iVar6 = find_namespace_imports
                      ((FILE *)__stream_01,(char **)&import_modules,&local_38,
                       (char **)&import_prefixes,&local_88,&local_50,&local_70,
                       (int *)((long)&buf + 4));
    ppcVar12 = import_prefixes;
    iVar4 = -1;
    if (iVar6 == 0) {
      prefix = (char *)pFVar7;
      if (yVar5 == YANG_SUBMODULE) {
        __stream_00 = (FILE *)open_module((char *)import_prefixes,pcVar15);
        if (__stream_00 == (FILE *)0x0) {
LAB_00102032:
          __stream_00 = (FILE *)0x0;
          fprintf(_stderr,"Failed to open the module \"%s\".\n",ppcVar12);
LAB_00102039:
          import_count = -1;
        }
        else {
          free(ppcVar12);
          import_prefixes = (char **)0x0;
          iVar4 = find_namespace_imports
                            ((FILE *)__stream_00,(char **)&import_modules,&local_38,
                             (char **)&import_prefixes,(char **)0x0,(char ***)0x0,(char ***)0x0,
                             (int *)0x0);
          import_count = -1;
          if (iVar4 == 0) {
            fclose(__stream_00);
            goto LAB_00101c10;
          }
        }
      }
      else {
LAB_00101c10:
        if (0 < (int)buf._4_4_) {
          lVar13 = 0;
          do {
            __stream_00 = (FILE *)open_module(local_50[lVar13],pcVar15);
            if (__stream_00 == (FILE *)0x0) {
              ppcVar12 = (char **)local_50[lVar13];
              goto LAB_00102032;
            }
            free(local_50[lVar13]);
            local_50[lVar13] = (char *)0x0;
            iVar4 = find_namespace_imports
                              ((FILE *)__stream_00,(char **)&import_modules,&local_38,
                               local_50 + lVar13,(char **)0x0,(char ***)0x0,(char ***)0x0,(int *)0x0
                              );
            if (iVar4 != 0) goto LAB_00102039;
            fclose(__stream_00);
            lVar13 = lVar13 + 1;
          } while (lVar13 < (int)buf._4_4_);
        }
        rewind(__stream_01);
        fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27,1,local_58);
        pcVar9 = get_word((FILE *)__stream_01,(char **)&import_modules,&local_38);
        if (pcVar9 == (char *)0x0) {
LAB_0010206f:
          import_count = -1;
        }
        else {
          yVar5 = get_keyword(pcVar9,(yang_arg *)&name_space);
          uVar3 = buf._4_4_;
          ppcVar2 = local_50;
          ppcVar1 = import_prefixes;
          ppcVar12 = local_70;
          pcVar11 = local_88;
          if ((yVar5 == YANG_MODULE) || (yVar5 == YANG_SUBMODULE)) {
            uVar10 = (ulong)buf._4_4_;
            name_space._4_4_ = (yang_arg)name_space;
            local_74 = yVar5;
            if (yVar5 == YANG_SUBMODULE) {
              fwrite("<submodule name=\"",0x11,1,local_58);
              pcVar9 = "submodule";
            }
            else {
              if (yVar5 != YANG_MODULE) {
                main_cold_5();
                goto LAB_0010206f;
              }
              fwrite("<module name=\"",0xe,1,local_58);
              pcVar9 = "module";
            }
            if ((yang_arg)name_space != Y_IDENTIF_ARG) {
              main_cold_3();
              goto LAB_0010206f;
            }
            pcVar15 = get_word((FILE *)__stream_01,(char **)&import_modules,&local_38);
            pFVar7 = local_58;
            import_count = -1;
            if (pcVar15 != (char *)0x0) {
              fprintf(local_58,"%s\"",pcVar15);
              lVar13 = (ulong)(local_74 != YANG_MODULE) * 3 + 8;
              fprintf(pFVar7,"\n%*sxmlns=\"urn:ietf:params:xml:ns:yang:yin:1\"",lVar13," ");
              fprintf(pFVar7,"\n%*sxmlns:%s=\"%s\"",lVar13," ",pcVar11,ppcVar1);
              if (0 < (int)uVar3) {
                uVar14 = 0;
                do {
                  fprintf(pFVar7,"\n%*sxmlns:%s=\"%s\"",lVar13," ",ppcVar12[uVar14],ppcVar2[uVar14])
                  ;
                  uVar14 = uVar14 + 1;
                } while (uVar10 != uVar14);
              }
              pcVar11 = get_word((FILE *)__stream_01,(char **)&import_modules,&local_38);
              if (pcVar11 != (char *)0x0) {
                yVar5 = get_keyword(pcVar11,(yang_arg *)((long)&name_space + 4));
                if (yVar5 == YANG_LEFT_BRACE) {
                  fwrite(">\n",2,1,local_58);
                  do {
                    pcVar11 = get_word((FILE *)__stream_01,(char **)&import_modules,&local_38);
                    if (pcVar11 == (char *)0x0) break;
                    yVar5 = get_keyword(pcVar11,(yang_arg *)((long)&name_space + 4));
                    if (yVar5 == YANG_RIGHT_BRACE) {
                      pcVar15 = "</%s>\n";
                      import_count = 0;
                      pcVar11 = pcVar9;
                      pFVar7 = local_58;
                      goto LAB_00101fd8;
                    }
                    if (yVar5 == YANG_UNKNOWN) {
                      pcVar15 = "Unexpected characters (\"%.20s\"...).\n";
                      pFVar7 = _stderr;
                      goto LAB_00101fd8;
                    }
                    iVar4 = print_keyword(yVar5,name_space._4_4_,(FILE *)local_58,1,
                                          (FILE *)__stream_01,(char **)&import_modules,&local_38);
                  } while (iVar4 == 0);
                }
                else if (yVar5 == YANG_UNKNOWN) {
                  pcVar15 = "Unexpected characters (\"%.20s\"...).\n";
                  pFVar7 = _stderr;
LAB_00101fd8:
                  fprintf(pFVar7,pcVar15,pcVar11);
                }
                else {
                  main_cold_4();
                }
              }
            }
          }
          else {
            import_count = -1;
            if (yVar5 == YANG_UNKNOWN) {
              __stream_00 = (FILE *)0x0;
              fprintf(_stderr,"Unexpected characters (\"%.20s\"...).\n",pcVar9);
              goto LAB_00102079;
            }
            main_cold_6();
          }
        }
        __stream_00 = (FILE *)0x0;
      }
LAB_00102079:
      free(import_prefixes);
      free(local_88);
      if (0 < (int)buf._4_4_) {
        lVar13 = 0;
        do {
          free(local_50[lVar13]);
          free(local_70[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 < (int)buf._4_4_);
      }
      free(local_50);
      free(local_70);
      pFVar7 = (FILE *)prefix;
      iVar4 = import_count;
      if (__stream_00 != (FILE *)0x0) {
        fclose(__stream_00);
        pFVar7 = (FILE *)prefix;
        iVar4 = import_count;
      }
    }
  }
  free(import_modules);
LAB_00101dba:
  if (pFVar7 != (FILE *)0x0) {
    fclose(pFVar7);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return iVar4;
}

Assistant:

int
main(int argc, char **argv)
{
    const char *in_file = NULL, *out_file = NULL, *search_dir = ".";
    char *ptr;
    FILE *input = NULL, *output = NULL;
    int ret = 1;

    switch (argc) {
    case 1:
        break;
    case 2:
        if (!strcmp(argv[1], "-h") || !strcmp(argv[1], "--help")) {
            fprintf(stdout, "Usage:\n\t%s [input-file] [output-file]\n", argv[0]);
            return 0;
        }
        in_file = argv[1];
        break;
    case 3:
        in_file = argv[1];
        out_file = argv[2];
        break;
    default:
        fprintf(stderr, "Invalid arguments.\n");
        return 1;
    }

    if (in_file) {
        input = fopen(in_file, "r");
        if (!input) {
            fprintf(stderr, "Failed to open \"%s\" for reading (%s).\n", in_file, strerror(errno));
            goto cleanup;
        }

        if ((ptr = strrchr(in_file, '/'))) {
            *ptr = '\0';
            search_dir = in_file;
        }
    }
    if (out_file) {
        output = fopen(out_file, "w");
        if (!input) {
            fprintf(stderr, "Failed to open \"%s\" for writing (%s).\n", out_file, strerror(errno));
            goto cleanup;
        }
    }

    ret = convert_yang2yin(output ? output : stdout, input ? input : stdin, search_dir);

cleanup:
    if (input) {
        fclose(input);
    }
    if (output) {
        fclose(output);
    }
    return ret;
}